

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::ReservoirSamplePercentage::ReservoirSamplePercentage
          (ReservoirSamplePercentage *this,Allocator *allocator,double percentage,int64_t seed)

{
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var1;
  uint32_t uVar2;
  ulong uVar3;
  pointer this_00;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> this_01;
  pointer *__ptr;
  pointer *__ptr_1;
  double dVar4;
  
  BlockingSample::BlockingSample(&this->super_BlockingSample,seed);
  (this->super_BlockingSample)._vptr_BlockingSample =
       (_func_int **)&PTR__ReservoirSamplePercentage_01999310;
  this->allocator = allocator;
  this->sample_percentage = percentage / 100.0;
  dVar4 = (percentage / 100.0) * 100000.0;
  uVar3 = (ulong)dVar4;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = (ReservoirSample *)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->finished_samples).
  super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->finished_samples).
           super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->current_count + 1) = 0;
  this->reservoir_sample_size = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  this_00 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
            ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
  uVar2 = RandomEngine::NextRandomInteger((RandomEngine *)this_00);
  this_01._M_head_impl = (ReservoirSample *)operator_new(0x58);
  ReservoirSample::ReservoirSample
            (this_01._M_head_impl,allocator,this->reservoir_sample_size,(ulong)uVar2);
  _Var1._M_head_impl =
       (this->current_sample).
       super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var1._M_head_impl != (ReservoirSample *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BlockingSample + 8))();
  }
  (this->super_BlockingSample).type = RESERVOIR_PERCENTAGE_SAMPLE;
  return;
}

Assistant:

ReservoirSamplePercentage::ReservoirSamplePercentage(Allocator &allocator, double percentage, int64_t seed)
    : BlockingSample(seed), allocator(allocator), sample_percentage(percentage / 100.0), current_count(0),
      is_finalized(false) {
	reservoir_sample_size = (idx_t)(sample_percentage * RESERVOIR_THRESHOLD);
	current_sample = make_uniq<ReservoirSample>(allocator, reservoir_sample_size, base_reservoir_sample->random());
	type = SampleType::RESERVOIR_PERCENTAGE_SAMPLE;
}